

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
           *this)

{
  PromiseArenaMember *node;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::destroy(&this->attachment);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_00708b58;
  node = &((this->super_AttachmentPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }